

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_distribution(Integer g_a,Integer proc,Integer *lo,Integer *hi)

{
  global_array_t *pgVar1;
  short sVar2;
  ushort uVar3;
  int iVar4;
  C_Integer *pCVar5;
  global_array_t *pgVar6;
  int _i;
  Integer IVar7;
  ulong uVar8;
  C_Integer CVar9;
  undefined4 uVar10;
  C_Integer CVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  char err_string [256];
  
  lVar13 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar13)) {
    sprintf(err_string,"%s: INVALID ARRAY HANDLE","nga_distribution");
    pnga_error(err_string,g_a);
  }
  if (GA[lVar13].actv == 0) {
    sprintf(err_string,"%s: ARRAY NOT ACTIVE","nga_distribution");
    pnga_error(err_string,g_a);
  }
  CVar11 = proc;
  if (0 < GA[lVar13].num_rstrctd) {
    CVar11 = GA[lVar13].rank_rstrctd[proc];
  }
  if (GA[lVar13].property == 1) {
    IVar7 = pnga_cluster_proc_nodeid(proc);
    IVar7 = pnga_cluster_nprocs(IVar7);
    CVar11 = proc % IVar7;
  }
  pgVar6 = GA;
  pgVar1 = GA + lVar13;
  iVar14 = GA[lVar13].distr_type;
  if (iVar14 - 1U < 3) {
    sVar2 = pgVar1->ndim;
    lVar12 = (long)(int)CVar11 % pgVar1->num_blocks[0];
    uVar10 = (undefined4)lVar12;
    err_string[0] = (char)uVar10;
    err_string[1] = SUB41(uVar10,1);
    err_string[2] = SUB41(uVar10,2);
    err_string[3] = SUB41(uVar10,3);
    lVar13 = 0;
    while (lVar13 + 1 < (long)sVar2) {
      CVar11 = (long)((int)CVar11 - (int)lVar12) / GA[g_a + 1000].num_blocks[lVar13];
      lVar12 = (long)(int)CVar11 % GA[g_a + 1000].num_blocks[lVar13 + 1];
      *(int *)(err_string + lVar13 * 4 + 4) = (int)lVar12;
      lVar13 = lVar13 + 1;
    }
    uVar8 = 0;
    uVar15 = (int)sVar2;
    if (sVar2 < 1) {
      uVar15 = 0;
    }
    for (; pgVar1 = GA, (uVar15 & 0xffff) << 2 != uVar8; uVar8 = uVar8 + 4) {
      iVar14 = *(int *)(err_string + uVar8);
      *(long *)((long)lo + uVar8 * 2) =
           *(long *)((long)GA[g_a + 1000].block_dims + uVar8 * 2) * (long)iVar14 + 1;
      lVar12 = ((long)iVar14 + 1) * *(long *)((long)pgVar1[g_a + 1000].block_dims + uVar8 * 2);
      *(long *)((long)hi + uVar8 * 2) = lVar12;
      lVar13 = *(long *)((long)pgVar1[g_a + 1000].dims + uVar8 * 2);
      if (lVar13 <= lVar12) {
        lVar12 = lVar13;
      }
      *(long *)((long)hi + uVar8 * 2) = lVar12;
    }
  }
  else if (iVar14 == 4) {
    sVar2 = pgVar1->ndim;
    lVar18 = (long)(int)CVar11 % pgVar1->num_blocks[0];
    uVar10 = (undefined4)lVar18;
    err_string[0] = (char)uVar10;
    err_string[1] = SUB41(uVar10,1);
    err_string[2] = SUB41(uVar10,2);
    err_string[3] = SUB41(uVar10,3);
    lVar12 = 0;
    while (lVar12 + 1 < (long)sVar2) {
      CVar11 = (long)((int)CVar11 - (int)lVar18) / GA[g_a + 1000].num_blocks[lVar12];
      lVar18 = (long)(int)CVar11 % GA[g_a + 1000].num_blocks[lVar12 + 1];
      *(int *)(err_string + lVar12 * 4 + 4) = (int)lVar18;
      lVar12 = lVar12 + 1;
    }
    uVar8 = 0;
    uVar15 = (int)sVar2;
    if (sVar2 < 1) {
      uVar15 = 0;
    }
    pgVar6 = GA + lVar13;
    iVar14 = 0;
    for (; (uVar15 & 0xffff) << 2 != uVar8; uVar8 = uVar8 + 4) {
      pCVar5 = pgVar6->mapc;
      iVar4 = *(int *)(err_string + uVar8);
      lVar13 = (long)iVar14 + (long)iVar4;
      *(C_Integer *)((long)lo + uVar8 * 2) = pCVar5[lVar13];
      if ((long)iVar4 < *(long *)((long)pgVar1->num_blocks + uVar8 * 2) + -1) {
        lVar13 = pCVar5[lVar13 + 1] + -1;
      }
      else {
        lVar13 = *(long *)((long)pgVar1->dims + uVar8 * 2);
      }
      *(long *)((long)hi + uVar8 * 2) = lVar13;
      iVar14 = iVar14 + *(int *)((long)pgVar1->num_blocks + uVar8 * 2);
    }
  }
  else if (iVar14 == 0) {
    if (pgVar1->num_rstrctd == 0) {
      uVar3 = pgVar1->ndim;
      uVar8 = 0;
      if ((short)uVar3 < 1) {
        uVar3 = 0;
      }
      uVar17 = (ulong)uVar3;
      lVar13 = 1;
      for (; uVar17 != uVar8; uVar8 = uVar8 + 1) {
        lVar13 = lVar13 * GA[g_a + 1000].nblock[uVar8];
      }
      if ((CVar11 < 0) || (lVar13 <= CVar11)) {
        for (uVar8 = 0; uVar17 != uVar8; uVar8 = uVar8 + 1) {
          lo[uVar8] = 0;
          hi[uVar8] = -1;
        }
      }
      else {
        lVar13 = 0;
        for (uVar8 = 0; uVar17 != uVar8; uVar8 = uVar8 + 1) {
          lVar18 = (long)pgVar6[g_a + 1000].nblock[uVar8];
          lVar12 = CVar11 % lVar18;
          pCVar5 = pgVar1->mapc;
          lo[uVar8] = pCVar5[lVar12 + lVar13];
          if (lVar12 == lVar18 + -1) {
            CVar9 = pgVar6[g_a + 1000].dims[uVar8];
          }
          else {
            CVar9 = pCVar5[lVar12 + lVar13 + 1] + -1;
          }
          lVar13 = lVar13 + lVar18;
          hi[uVar8] = CVar9;
          CVar11 = CVar11 / lVar18;
        }
      }
    }
    else {
      uVar15._0_2_ = pgVar1->ndim;
      uVar15._2_2_ = pgVar1->irreg;
      uVar16 = 0;
      if (0 < (short)(undefined2)uVar15) {
        uVar16 = uVar15;
      }
      uVar8 = (ulong)(uVar16 & 0xffff);
      if (CVar11 < pgVar1->num_rstrctd) {
        lVar13 = 1;
        for (uVar17 = 0; uVar8 != uVar17; uVar17 = uVar17 + 1) {
          lVar13 = lVar13 * GA[g_a + 1000].nblock[uVar17];
        }
        if ((CVar11 < 0) || (lVar13 <= CVar11)) {
          for (uVar17 = 0; uVar8 != uVar17; uVar17 = uVar17 + 1) {
            lo[uVar17] = 0;
            hi[uVar17] = -1;
          }
        }
        else {
          lVar13 = 0;
          for (uVar17 = 0; uVar8 != uVar17; uVar17 = uVar17 + 1) {
            lVar18 = (long)pgVar6[g_a + 1000].nblock[uVar17];
            lVar12 = CVar11 % lVar18;
            pCVar5 = pgVar1->mapc;
            lo[uVar17] = pCVar5[lVar12 + lVar13];
            if (lVar12 == lVar18 + -1) {
              CVar9 = pgVar6[g_a + 1000].dims[uVar17];
            }
            else {
              CVar9 = pCVar5[lVar12 + lVar13 + 1] + -1;
            }
            lVar13 = lVar13 + lVar18;
            hi[uVar17] = CVar9;
            CVar11 = CVar11 / lVar18;
          }
        }
      }
      else {
        for (uVar17 = 0; uVar8 != uVar17; uVar17 = uVar17 + 1) {
          lo[uVar17] = 0;
          hi[uVar17] = -1;
        }
      }
    }
  }
  return;
}

Assistant:

void pnga_distribution(Integer g_a, Integer proc, Integer *lo, Integer * hi)
{
  Integer ga_handle, lproc, old_grp;

  ga_check_handleM(g_a, "nga_distribution");
  ga_handle = (GA_OFFSET + g_a);

  lproc = proc;
  if (GA[ga_handle].num_rstrctd > 0) {
    lproc = GA[ga_handle].rank_rstrctd[lproc];
  }
  /* This currently assumes that read-only property can only be applied to
   * processors on the world group */
  if (GA[ga_handle].property == READ_ONLY) {
    Integer node = pnga_cluster_proc_nodeid(proc);
    Integer nodesize = pnga_cluster_nprocs(node);
    lproc = proc%nodesize;
  }
  ga_ownsM(ga_handle, lproc, lo, hi);
}